

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O2

descriptor_state *
asio::detail::object_pool_access::create<asio::detail::epoll_reactor::descriptor_state>(void)

{
  descriptor_state *this;
  
  this = (descriptor_state *)operator_new(0x98);
  epoll_reactor::descriptor_state::descriptor_state(this);
  return this;
}

Assistant:

static Object* create()
  {
    return new Object;
  }